

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_array_global.cpp
# Opt level: O1

void __thiscall
optimization::func_array_global::Func_Array_Global::optimize_func
          (Func_Array_Global *this,MirFunction *func,MirPackage *mir)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *psVar3;
  uint uVar4;
  pointer puVar5;
  pointer pcVar6;
  __uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> _Var7;
  size_type *psVar8;
  size_type sVar9;
  uint32_t uVar10;
  _Head_base<0UL,_mir::inst::RefInst_*,_false> _Var11;
  pointer puVar12;
  int iVar13;
  _Rb_tree_node_base *p_Var14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  MirFunction *pMVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  uint extraout_var;
  long *plVar21;
  long lVar22;
  ostream *poVar23;
  tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> tVar24;
  RefInst *pRVar25;
  undefined4 extraout_var_00;
  iterator __position;
  RefInst *pRVar26;
  undefined4 extraout_var_01;
  _Base_ptr p_Var27;
  undefined8 uVar28;
  int iVar29;
  _Rb_tree_header *p_Var30;
  _Base_ptr p_Var31;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Rb_tree_header *p_Var32;
  pointer __args;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *__args_00;
  iterator __begin5;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *this_00;
  _Alloc_hider _Var33;
  iterator __end5;
  ulong uVar34;
  pointer *__ptr;
  bool bVar35;
  pair<std::_Rb_tree_iterator<mir::inst::VarId>,_std::_Rb_tree_iterator<mir::inst::VarId>_> pVar36;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  pVar37;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> ptr_1;
  VarId var;
  VarId var_3;
  VarId init_var;
  GlobalVarManager gvm;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> ref_results;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> vars;
  VarId ref_var;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  init_insts;
  string name;
  mapped_type def_point;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  call_insts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> val;
  Var_Replace vp;
  string local_440;
  _Base_ptr local_420;
  Function local_418;
  _Base_ptr local_3c0;
  _Base_ptr local_3b8;
  _Head_base<0UL,_mir::inst::RefInst_*,_false> local_3b0;
  size_type local_3a8;
  undefined1 local_3a0 [24];
  key_type local_388;
  undefined **local_378;
  undefined8 local_370;
  _Head_base<0UL,_mir::inst::RefInst_*,_false> local_368;
  undefined1 *local_360;
  undefined8 local_358;
  undefined1 local_350;
  undefined7 uStack_34f;
  undefined1 local_340;
  undefined1 local_338 [8];
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_330;
  undefined1 local_300 [8];
  undefined1 local_2f8 [16];
  _Rb_tree_node_base *local_2e8;
  _Base_ptr local_2d8;
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
  local_2c8;
  undefined **local_298;
  key_type_conflict local_290 [2];
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_288;
  string local_270;
  _Base_ptr local_250;
  pthread_mutex_t *local_248;
  mapped_type local_240;
  string local_238;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_218;
  _Rb_tree_node_base *local_1f8;
  element_type *local_1f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  undefined8 local_1e0;
  _Rb_tree_node_base *local_1d8;
  element_type *local_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  undefined8 local_1c0;
  _func_int **local_1b8;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_1b0;
  _Rb_tree_node_base *local_1a8;
  pointer local_1a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_198;
  Timestamp local_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  undefined **local_150;
  undefined4 local_148;
  undefined **local_140;
  uint local_138;
  undefined **local_130;
  undefined4 local_128;
  undefined **local_120;
  uint local_118;
  VarId local_110;
  undefined1 local_100 [8];
  variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  _Optional_payload_base<int> local_d0;
  Var_Replace local_c8;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_60;
  
  if (((func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (iVar13 = std::__cxx11::string::compare((char *)&func->name), iVar13 != 0)) {
    p_Var16 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_378 = (undefined **)mir;
    var_replace::Var_Replace::Var_Replace(&local_c8,func);
    local_330._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_330._M_impl.super__Rb_tree_header._M_header;
    local_330._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_330._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_330._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var27 = p_Var16[3]._M_parent;
    p_Var31 = p_Var16[3]._M_left;
    local_3a0._16_8_ = func;
    local_370 = p_Var16;
    local_330._M_impl.super__Rb_tree_header._M_header._M_right =
         local_330._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var27 != p_Var31) {
      do {
        iVar13 = (**(code **)(**(long **)p_Var27 + 8))();
        if (iVar13 == 2) {
          (**(code **)(**(long **)p_Var27 + 0x10))(&local_60);
          bVar35 = local_60._M_impl.super__Rb_tree_header._M_node_count != 0;
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree(&local_60);
        }
        else {
          bVar35 = false;
        }
        func = (MirFunction *)local_3a0._16_8_;
        if (bVar35) {
          std::
          _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
          ::_M_insert_unique<mir::inst::VarId_const&>
                    ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                      *)&local_330,(VarId *)(*(long *)p_Var27 + 8));
        }
        p_Var27 = (_Base_ptr)&p_Var27->_M_parent;
      } while (p_Var27 != p_Var31);
    }
    p_Var16 = ((_Base_ptr)(local_370 + 0x60))->_M_parent;
    local_3b8 = ((_Base_ptr)(local_370 + 0x60))->_M_left;
    if (p_Var16 != local_3b8) {
      do {
        iVar13 = (**(code **)(**(long **)p_Var16 + 8))();
        if (iVar13 == 4) {
          (**(code **)(**(long **)p_Var16 + 0x10))(local_300);
          p_Var14 = local_2e8;
          if (local_2e8 != (_Rb_tree_node_base *)local_2f8 && (_Base_ptr)0x1 < local_2d8) {
            do {
              local_418._vptr_Function = (_func_int **)&PTR_display_001ee058;
              uVar4 = *(uint *)&p_Var14[1]._M_parent;
              local_418.name._M_dataplus._M_p._0_4_ = uVar4;
              p_Var27 = &local_330._M_impl.super__Rb_tree_header._M_header;
              for (p_Var31 = local_330._M_impl.super__Rb_tree_header._M_header._M_parent;
                  (_Rb_tree_header *)p_Var31 != (_Rb_tree_header *)0x0;
                  p_Var31 = (&p_Var31->_M_left)[*(uint *)((long)(p_Var31 + 1) + 8) < uVar4]) {
                if (*(uint *)((long)(p_Var31 + 1) + 8) >= uVar4) {
                  p_Var27 = p_Var31;
                }
              }
              p_Var32 = &local_330._M_impl.super__Rb_tree_header;
              p_Var30 = p_Var32;
              if (((_Rb_tree_header *)p_Var27 != p_Var32) &&
                 (p_Var30 = (_Rb_tree_header *)p_Var27, uVar4 < *(uint *)((long)p_Var27 + 0x28))) {
                p_Var30 = p_Var32;
              }
              if (p_Var30 != p_Var32) {
                pVar36 = std::
                         _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         ::equal_range(&local_330,(key_type *)&local_418);
                std::
                _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::_M_erase_aux(&local_330,(_Base_ptr)pVar36.first._M_node,
                               (_Base_ptr)pVar36.second._M_node);
              }
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
            } while (p_Var14 != (_Rb_tree_node_base *)local_2f8);
          }
LAB_001534a7:
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       *)local_300);
        }
        else {
          iVar13 = (**(code **)(**(long **)p_Var16 + 8))();
          if ((iVar13 == 6) &&
             (iVar13 = std::__cxx11::string::compare((char *)(*(long *)p_Var16 + 0x18)), iVar13 != 0
             )) {
            (**(code **)(**(long **)p_Var16 + 0x10))(local_300);
            p_Var14 = local_2e8;
            if (local_2e8 != (_Rb_tree_node_base *)local_2f8 && (_Base_ptr)0x1 < local_2d8) {
              do {
                local_418._vptr_Function = (_func_int **)&PTR_display_001ee058;
                uVar4 = *(uint *)&p_Var14[1]._M_parent;
                local_418.name._M_dataplus._M_p._0_4_ = uVar4;
                p_Var27 = &local_330._M_impl.super__Rb_tree_header._M_header;
                for (p_Var31 = local_330._M_impl.super__Rb_tree_header._M_header._M_parent;
                    p_Var31 != (_Base_ptr)0x0; p_Var31 = (&p_Var31->_M_left)[bVar35]) {
                  bVar35 = *(uint *)&p_Var31[1]._M_parent < uVar4;
                  if (!bVar35) {
                    p_Var27 = p_Var31;
                  }
                }
                p_Var32 = &local_330._M_impl.super__Rb_tree_header;
                p_Var31 = &p_Var32->_M_header;
                if (((_Rb_tree_header *)p_Var27 != p_Var32) &&
                   (p_Var31 = p_Var27, uVar4 < *(uint *)&p_Var27[1]._M_parent)) {
                  p_Var31 = &p_Var32->_M_header;
                }
                if ((_Rb_tree_header *)p_Var31 != p_Var32) {
                  pVar36 = std::
                           _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           ::equal_range(&local_330,(key_type *)&local_418);
                  std::
                  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::_M_erase_aux(&local_330,(_Base_ptr)pVar36.first._M_node,
                                 (_Base_ptr)pVar36.second._M_node);
                }
                p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
              } while (p_Var14 != (_Rb_tree_node_base *)local_2f8);
            }
            goto LAB_001534a7;
          }
        }
        p_Var16 = (_Base_ptr)&p_Var16->_M_parent;
      } while (p_Var16 != local_3b8);
    }
    p_Var16 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_3c0 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var16 != local_3c0) {
      do {
        local_420 = p_Var16;
        if (p_Var16[1]._M_color != *(_Rb_tree_color *)&((_Base_ptr)(local_370 + 0x20))->_M_left) {
          p_Var27 = p_Var16[3]._M_parent;
          local_3b8 = p_Var16[3]._M_left;
          if (p_Var27 != local_3b8) {
            do {
              p_Var32 = &local_330._M_impl.super__Rb_tree_header;
              iVar13 = (**(code **)(**(long **)p_Var27 + 8))();
              if (iVar13 == 4) {
                p_Var16 = local_330._M_impl.super__Rb_tree_header._M_header._M_left;
                if ((_Rb_tree_header *)local_330._M_impl.super__Rb_tree_header._M_header._M_left !=
                    p_Var32) {
LAB_00153580:
                  do {
                    local_418._vptr_Function = (_func_int **)&PTR_display_001ee058;
                    local_418.name._M_dataplus._M_p._0_4_ = *(undefined4 *)&p_Var16[1]._M_parent;
                    (**(code **)(**(long **)p_Var27 + 0x10))
                              ((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                *)local_300);
                    p_Var15 = (_Base_ptr)local_2f8;
                    for (p_Var31 = (_Base_ptr)local_2f8._8_8_; p_Var31 != (_Base_ptr)0x0;
                        p_Var31 = (&p_Var31->_M_left)[bVar35]) {
                      bVar35 = *(uint *)&p_Var31[1]._M_parent <
                               (uint)local_418.name._M_dataplus._M_p;
                      if (!bVar35) {
                        p_Var15 = p_Var31;
                      }
                    }
                    p_Var31 = (_Base_ptr)local_2f8;
                    if ((p_Var15 != (_Base_ptr)local_2f8) &&
                       (p_Var31 = p_Var15,
                       (uint)local_418.name._M_dataplus._M_p < *(uint *)&p_Var15[1]._M_parent)) {
                      p_Var31 = (_Base_ptr)local_2f8;
                    }
                    std::
                    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                 *)local_300);
                    if (p_Var31 != (_Base_ptr)local_2f8) {
                      pVar36 = std::
                               _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                               ::equal_range(&local_330,(key_type *)&local_418);
                      std::
                      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      ::_M_erase_aux(&local_330,(_Base_ptr)pVar36.first._M_node,
                                     (_Base_ptr)pVar36.second._M_node);
                      break;
                    }
                    p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
                  } while ((_Rb_tree_header *)p_Var16 != &local_330._M_impl.super__Rb_tree_header);
                }
              }
              else {
                iVar13 = (**(code **)(**(long **)p_Var27 + 8))();
                p_Var16 = local_330._M_impl.super__Rb_tree_header._M_header._M_left;
                if ((_Rb_tree_header *)local_330._M_impl.super__Rb_tree_header._M_header._M_left !=
                    p_Var32 && iVar13 == 6) goto LAB_00153580;
              }
              p_Var27 = (_Base_ptr)&p_Var27->_M_parent;
            } while (p_Var27 != local_3b8);
          }
        }
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(local_420);
      } while (p_Var16 != local_3c0);
    }
    if (local_330._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_338 = (undefined1  [8])local_378;
      local_288.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_288.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
      local_288.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
      local_218.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_218.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
      local_218.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
      pMVar17 = GlobalVarManager::get_init_func((GlobalVarManager *)local_338);
      local_250 = (pMVar17->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var16 = local_250[3]._M_parent;
      p_Var27 = local_250[3]._M_left;
      if (p_Var16 != p_Var27) {
        bVar35 = false;
        do {
          iVar13 = (**(code **)(**(long **)p_Var16 + 8))();
          if (iVar13 == 6) {
            bVar35 = true;
          }
          this_00 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                     *)&local_218;
          if (!bVar35) {
            this_00 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                       *)&local_288;
          }
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (this_00,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             p_Var16);
          p_Var16 = (_Base_ptr)&p_Var16->_M_parent;
        } while (p_Var16 != p_Var27);
      }
      p_Var31 = local_250;
      uVar28 = local_370;
      p_Var16 = local_250[3]._M_parent;
      p_Var27 = local_250[3]._M_left;
      p_Var15 = p_Var16;
      if (p_Var27 != p_Var16) {
        do {
          if (*(long **)p_Var15 != (long *)0x0) {
            (**(code **)(**(long **)p_Var15 + 0x28))();
          }
          *(long *)p_Var15 = 0;
          p_Var15 = (_Base_ptr)&p_Var15->_M_parent;
        } while (p_Var15 != p_Var27);
        p_Var31[3]._M_left = p_Var16;
      }
      if ((_Rb_tree_header *)local_330._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_330._M_impl.super__Rb_tree_header) {
        local_1b0 = (map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     *)(local_3a0._16_8_ + 0x68);
        local_3b8 = (_Base_ptr)&((_Base_ptr)(uVar28 + 0x60))->_M_parent;
        p_Var16 = (_Base_ptr)(local_3a0._16_8_ + 0x38);
        local_1b8 = (_func_int **)&PTR_display_001f0778;
        local_378 = &PTR_display_001f0198;
        local_420 = (_Base_ptr)&PTR_display_001eff98;
        psVar1 = &local_418.name;
        p_Var27 = local_330._M_impl.super__Rb_tree_header._M_header._M_left;
        local_3c0 = p_Var16;
        do {
          local_388.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
          local_388.id = *(uint32_t *)&p_Var27[1]._M_parent;
          var_replace::Var_Replace::Var_Replace
                    ((Var_Replace *)local_300,(MirFunction *)local_3a0._16_8_);
          pmVar18 = std::
                    map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                    ::at((map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                          *)&local_2c8,&local_388);
          local_240 = *pmVar18;
          local_1a8 = p_Var27;
          pmVar19 = std::
                    map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    ::at(local_1b0,&local_240.first);
          uVar34 = (ulong)local_240.second;
          puVar5 = (pmVar19->inst).
                   super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(pmVar19->inst).
                            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3) <=
              uVar34) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar34);
LAB_0015477e:
            std::__throw_bad_optional_access();
          }
          (**(code **)(*(long *)puVar5[uVar34]._M_t.
                                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                ._M_t + 0x10))(&local_418);
          local_298 = &PTR_display_001ee058;
          local_290[0] = *(key_type_conflict *)(local_418.name.field_2._M_allocated_capacity + 0x28)
          ;
          local_1a0 = puVar5;
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       *)&local_418);
          pmVar20 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          *)p_Var16,local_290);
          iVar13 = (*(((pmVar20->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_Displayable)._vptr_Displayable[3])();
          if ((extraout_var & 1) == 0) goto LAB_0015477e;
          iVar29 = iVar13 + 3;
          if (-1 < iVar13) {
            iVar29 = iVar13;
          }
          local_418._vptr_Function =
               (_func_int **)((ulong)local_418._vptr_Function & 0xffffffff00000000);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_198,(long)(iVar29 >> 2),(value_type *)&local_418,
                     (allocator_type *)&local_368);
          pcVar6 = (((string *)(local_3a0._16_8_ + 8))->_M_dataplus)._M_p;
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,pcVar6,
                     pcVar6 + ((string *)(local_3a0._16_8_ + 8))->_M_string_length);
          local_110.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
          local_110.id = local_290[0];
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_168,&local_198);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_100 + 8),
                     &local_168);
          local_f8.
          super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          ._M_index = 1;
          local_100 = (undefined1  [8])local_1b8;
          local_f8.
          super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          ._36_4_ = Word;
          local_d0._M_payload = (_Storage<int,_true>)0x0;
          local_d0._M_engaged = false;
          local_d0._5_3_ = 0;
          GlobalVarManager::add_global_var
                    (&local_270,(GlobalVarManager *)local_338,&local_238,&local_110,
                     (ConstValue *)local_100);
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr
            [local_f8.
             super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
             .
             super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
             .
             super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
             .
             super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
             .
             super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
             ._M_index]._M_data)
                    ((anon_class_1_0_00000001 *)&local_418,
                     (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_100 + 8));
          local_f8.
          super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          ._M_index = 0xff;
          if (local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_168.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_168.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_168.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0)
          {
            plVar21 = (long *)0x0;
          }
          else {
            plVar21 = (long *)__dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                                      *(long *)(std::clog + -0x18)),
                                             &std::streambuf::typeinfo,&AixLog::Log::typeinfo);
          }
          if (plVar21 != (long *)0x0) {
            local_248 = (pthread_mutex_t *)(plVar21 + 0x29);
            iVar13 = pthread_mutex_lock(local_248);
            if (iVar13 == 0) {
              if ((char)plVar21[0x10] != '\0') {
                (**(code **)(*plVar21 + 0x30))(plVar21);
                *(undefined1 *)(plVar21 + 0x10) = 0;
                plVar21[0x23] = 0;
                *(undefined1 *)(plVar21 + 0x24) = 1;
                local_418._vptr_Function = (_func_int **)&PTR__Tag_001edee0;
                paVar2 = &local_418.name.field_2;
                local_418.name._M_string_length = 0;
                local_418.name.field_2._M_allocated_capacity =
                     local_418.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_418.file._M_dataplus._M_p._0_1_ = 1;
                local_418.name._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_assign((string *)(plVar21 + 0x12));
                *(undefined1 *)(plVar21 + 0x16) = local_418.file._M_dataplus._M_p._0_1_;
                local_418._vptr_Function = (_func_int **)&PTR__Tag_001edee0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418.name._M_dataplus._M_p != paVar2) {
                  operator_delete(local_418.name._M_dataplus._M_p,
                                  (ulong)(local_418.name.field_2._M_allocated_capacity + 1));
                }
                AixLog::Function::Function(&local_418,(nullptr_t)0x0);
                std::__cxx11::string::_M_assign((string *)(plVar21 + 0x18));
                std::__cxx11::string::_M_assign((string *)(plVar21 + 0x1c));
                *(bool *)(plVar21 + 0x21) = local_418.is_null_;
                plVar21[0x20] = local_418.line;
                AixLog::Function::~Function(&local_418);
                *(undefined1 *)(plVar21 + 0x25) = 1;
              }
              pthread_mutex_unlock(local_248);
              goto LAB_00153bc0;
            }
LAB_0015478a:
            iVar13 = std::__throw_system_error(iVar13);
LAB_00154791:
            iVar13 = std::__throw_system_error(iVar13);
LAB_00154798:
            uVar28 = std::__throw_system_error(iVar13);
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::~vector(&local_218);
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::~vector(&local_288);
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree(&local_330);
            std::
            _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
            ::~_Rb_tree(&local_c8.defpoint._M_t);
            std::
            _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
            ::~_Rb_tree(&local_c8.usepoints._M_t);
            _Unwind_Resume(uVar28);
          }
          psVar8 = &local_418.name._M_string_length;
          local_418.name._M_dataplus._M_p = (pointer)0x5;
          local_418.name._M_string_length =
               CONCAT26(local_418.name._M_string_length._6_2_,0x6563617254);
          local_418._vptr_Function = (_func_int **)psVar8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,(char *)psVar8,5)
          ;
          if (local_418._vptr_Function != (_func_int **)psVar8) {
            operator_delete(local_418._vptr_Function,
                            (ulong)((long)&(((Inst *)local_418.name._M_string_length)->
                                           super_Displayable)._vptr_Displayable + 1));
          }
LAB_00153bc0:
          local_368._M_head_impl = (RefInst *)&PTR__Tag_001edee0;
          local_360 = &local_350;
          local_358 = 0;
          local_350 = 0;
          local_340 = 1;
          if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0)
          {
            lVar22 = 0;
          }
          else {
            lVar22 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                             *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo
                                    ,&AixLog::Log::typeinfo,0);
          }
          if (lVar22 != 0) {
            iVar13 = pthread_mutex_lock((pthread_mutex_t *)(lVar22 + 0x148));
            if (iVar13 != 0) goto LAB_00154798;
            std::__cxx11::string::_M_assign((string *)(lVar22 + 0x90));
            *(undefined1 *)(lVar22 + 0xb0) = local_340;
            pthread_mutex_unlock((pthread_mutex_t *)(lVar22 + 0x148));
          }
          local_180.time_point.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          local_180._vptr_Timestamp = (_func_int **)&PTR__Timestamp_001edeb0;
          local_180.is_null_ = false;
          if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0)
          {
            lVar22 = 0;
          }
          else {
            lVar22 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                             *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo
                                    ,&AixLog::Log::typeinfo,0);
          }
          if (lVar22 != 0) {
            iVar13 = pthread_mutex_lock((pthread_mutex_t *)(lVar22 + 0x148));
            if (iVar13 == 0) {
              *(bool *)(lVar22 + 0x120) = local_180.is_null_;
              ((duration *)(lVar22 + 0x118))->__r = (rep)local_180.time_point.__d.__r;
              pthread_mutex_unlock((pthread_mutex_t *)(lVar22 + 0x148));
              goto LAB_00153ddc;
            }
            goto LAB_00154791;
          }
          local_3b0._M_head_impl = (RefInst *)0x15;
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          local_440._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_440,(ulong)&local_3b0);
          local_440.field_2._M_allocated_capacity = (size_type)local_3b0._M_head_impl;
          *(undefined8 *)local_440._M_dataplus._M_p = 0x64252d6d252d5925;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 8) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 9) = '%';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 10) = 'H';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xb) = '-';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xc) = '%';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xd) = 'M';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xe) = '-';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xf) = '%';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xd) = 'M';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xe) = '-';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0xf) = '%';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0x10) = 'S';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0x11) = '.';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0x12) = '#';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0x13) = 'm';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p + 0x14) = 's';
          local_440._M_string_length = (size_type)local_3b0._M_head_impl;
          local_440._M_dataplus._M_p[(long)local_3b0._M_head_impl] = '\0';
          AixLog::Timestamp::to_string((string *)&local_418,&local_180,&local_440);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::clog,(char *)local_418._vptr_Function,
                     (long)local_418.name._M_dataplus._M_p);
          if (local_418._vptr_Function != (_func_int **)&local_418.name._M_string_length) {
            operator_delete(local_418._vptr_Function,
                            (ulong)((long)&(((Inst *)local_418.name._M_string_length)->
                                           super_Displayable)._vptr_Displayable + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,
                            (ulong)(local_440.field_2._M_allocated_capacity + 1));
          }
LAB_00153ddc:
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"optimize_func","");
          local_3b0._M_head_impl = (RefInst *)local_3a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/func_array_global.cpp"
                     ,"");
          sVar9 = local_440._M_string_length;
          local_418._vptr_Function = (_func_int **)&PTR__Function_001edf10;
          local_418.name._M_dataplus._M_p = (pointer)&local_418.name.field_2;
          paVar2 = &local_440.field_2;
          local_418.file._M_dataplus._M_p = (pointer)&local_418.file.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p == paVar2) {
            local_418.name.field_2._8_4_ = local_440.field_2._8_4_;
            local_418.name.field_2._12_4_ = local_440.field_2._12_4_;
          }
          else {
            local_418.name._M_dataplus._M_p = local_440._M_dataplus._M_p;
          }
          local_418.name.field_2._M_allocated_capacity = local_440.field_2._M_allocated_capacity;
          local_418.name._M_string_length = local_440._M_string_length;
          local_440._M_string_length = 0;
          local_440.field_2._M_allocated_capacity =
               local_440.field_2._M_allocated_capacity & 0xffffffffffffff00;
          if (local_3b0._M_head_impl == (RefInst *)local_3a0) {
            local_418.file.field_2._8_4_ = local_3a0._8_4_;
            local_418.file.field_2._12_4_ = local_3a0._12_4_;
          }
          else {
            local_418.file._M_dataplus._M_p = (pointer)local_3b0._M_head_impl;
          }
          local_418.file.field_2._M_allocated_capacity._4_4_ = local_3a0._4_4_;
          local_418.file.field_2._M_allocated_capacity._0_4_ = local_3a0._0_4_;
          local_418.file._M_string_length = local_3a8;
          local_3a8 = 0;
          local_3a0._0_4_ = local_3a0._0_4_ & 0xffffff00;
          local_418.line = 0x82;
          local_418.is_null_ = false;
          local_440._M_dataplus._M_p = (pointer)paVar2;
          local_3b0._M_head_impl = (RefInst *)local_3a0;
          if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0)
          {
            lVar22 = 0;
          }
          else {
            lVar22 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                             *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo
                                    ,&AixLog::Log::typeinfo,0);
          }
          if (lVar22 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,local_418.name._M_dataplus._M_p,sVar9);
          }
          else {
            iVar13 = pthread_mutex_lock((pthread_mutex_t *)(lVar22 + 0x148));
            if (iVar13 != 0) {
              iVar13 = std::__throw_system_error(iVar13);
              goto LAB_0015478a;
            }
            std::__cxx11::string::_M_assign((string *)(lVar22 + 0xc0));
            std::__cxx11::string::_M_assign((string *)(lVar22 + 0xe0));
            *(bool *)(lVar22 + 0x108) = local_418.is_null_;
            *(size_t *)(lVar22 + 0x100) = local_418.line;
            pthread_mutex_unlock((pthread_mutex_t *)(lVar22 + 0x148));
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::clog,"convert array ",0xe);
          (*(code *)*local_298)(&local_298,&std::clog);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"in ",3);
          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::clog,
                               (((string *)(local_3a0._16_8_ + 8))->_M_dataplus)._M_p,
                               ((string *)(local_3a0._16_8_ + 8))->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23," to global array ",0x11);
          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar23,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,"",0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
          std::ostream::put((char)poVar23);
          std::ostream::flush();
          AixLog::Function::~Function(&local_418);
          if (local_3b0._M_head_impl != (RefInst *)local_3a0) {
            operator_delete(local_3b0._M_head_impl,CONCAT44(local_3a0._4_4_,local_3a0._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,
                            (ulong)(local_440.field_2._M_allocated_capacity + 1));
          }
          local_368._M_head_impl = (RefInst *)&PTR__Tag_001edee0;
          if (local_360 != &local_350) {
            operator_delete(local_360,CONCAT71(uStack_34f,local_350) + 1);
          }
          tVar24.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
          super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
               operator_new(0x40);
          uVar10 = local_388.id;
          local_418._vptr_Function = (_func_int **)&local_418.name._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_418,local_270._M_dataplus._M_p,
                     local_270._M_dataplus._M_p + local_270._M_string_length);
          local_418.name.field_2._M_local_buf[8] = 1;
          *(undefined ***)
           ((long)tVar24.
                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8) =
               &PTR_display_001ee058;
          *(uint32_t *)
           ((long)tVar24.
                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x10) = uVar10;
          *(undefined ***)
           tVar24.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
           super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = local_378;
          std::__detail::__variant::
          _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)((long)tVar24.
                                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl
                               + 0x18),
                            (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_418);
          local_368._M_head_impl =
               (RefInst *)
               tVar24.
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
          std::__detail::__variant::
          _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_418);
          _Var11._M_head_impl = local_368._M_head_impl;
          local_368._M_head_impl = (RefInst *)0x0;
          _Var7._M_t.
          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
          super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
               local_1a0[uVar34]._M_t.
               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t;
          local_1a0[uVar34]._M_t.
          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t =
               (tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)_Var11._M_head_impl;
          if ((_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
              _Var7._M_t.
              super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
              super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl != (Inst *)0x0) {
            (**(code **)(*(long *)_Var7._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                        0x28))();
          }
          std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                     &local_368);
          pmVar20 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          *)local_3c0,&local_388.id);
          uVar28 = local_370;
          local_1d8 = local_420;
          local_1d0 = (pmVar20->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
          local_1c8 = (pmVar20->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
          if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_1c8->_M_use_count = local_1c8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_1c8->_M_use_count = local_1c8->_M_use_count + 1;
            }
          }
          local_1c0._0_1_ = pmVar20->is_memory_var;
          local_1c0._1_1_ = pmVar20->is_temp_var;
          local_1c0._2_1_ = pmVar20->is_phi_var;
          local_1c0._3_1_ = pmVar20->field_0x1b;
          local_1c0._4_4_ = pmVar20->priority;
          GlobalVarManager::get_new_init_id((GlobalVarManager *)&local_368,(Variable *)local_338);
          local_1d8 = local_420;
          if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8);
          }
          pRVar25 = (RefInst *)operator_new(0x40);
          uVar10 = (uint32_t)local_360;
          local_418._vptr_Function = (_func_int **)&local_418.name._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_418,local_270._M_dataplus._M_p,
                     local_270._M_dataplus._M_p + local_270._M_string_length);
          local_418.name.field_2._M_local_buf[8] = 1;
          (pRVar25->super_Inst).dest.super_Displayable._vptr_Displayable =
               (_func_int **)&PTR_display_001ee058;
          (pRVar25->super_Inst).dest.id = uVar10;
          (pRVar25->super_Inst).super_Displayable._vptr_Displayable = (_func_int **)local_378;
          std::__detail::__variant::
          _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&pRVar25->val,
                            (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_418);
          local_3b0._M_head_impl = pRVar25;
          std::__detail::__variant::
          _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_418);
          local_440._M_dataplus._M_p = (pointer)local_3b0._M_head_impl;
          local_3b0._M_head_impl = (RefInst *)0x0;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                      *)&local_288,
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     &local_440);
          if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_440._M_dataplus._M_p + 0x28))();
          }
          local_440._M_dataplus._M_p = (pointer)0x0;
          std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                     &local_3b0);
          p_Var16 = local_3c0;
          local_418._vptr_Function =
               (_func_int **)CONCAT44(local_418._vptr_Function._4_4_,local_290[0]);
          pVar37 = std::
                   _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   ::equal_range((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)local_3c0,(key_type_conflict *)&local_418);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          ::_M_erase_aux((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          *)p_Var16,(_Base_ptr)pVar37.first._M_node,(_Base_ptr)pVar37.second._M_node
                        );
          __position._M_current =
               (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               ((_Base_ptr)(uVar28 + 0x60))->_M_parent;
          while ((_Base_ptr)__position._M_current != ((_Base_ptr)(uVar28 + 0x60))->_M_left) {
            (*((((__position._M_current)->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
              _vptr_Displayable[2])(&local_418);
            pRVar26 = (RefInst *)psVar1;
            for (pRVar25 = (RefInst *)local_418.name._M_string_length; pRVar25 != (RefInst *)0x0;
                pRVar25 = *(RefInst **)((long)&(pRVar25->super_Inst).dest.id + (ulong)bVar35 * 8)) {
              bVar35 = *(uint *)((long)&(pRVar25->val).
                                        super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        .
                                        super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                        .
                                        super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                        .
                                        super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                        .
                                        super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                        .
                                        super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                        ._M_u + 0x10) < local_388.id;
              if (!bVar35) {
                pRVar26 = pRVar25;
              }
            }
            pRVar25 = (RefInst *)psVar1;
            if ((pRVar26 != (RefInst *)psVar1) &&
               (pRVar25 = pRVar26,
               local_388.id <
               *(uint *)((long)&(pRVar26->val).
                                super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .
                                super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                .
                                super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                .
                                super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                .
                                super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                .
                                super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                ._M_u + 0x10))) {
              pRVar25 = (RefInst *)psVar1;
            }
            if (pRVar25 != (RefInst *)psVar1) {
              iVar13 = (*((((__position._M_current)->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                         super_Displayable)._vptr_Displayable[1])();
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)&local_418);
              if (iVar13 != 4) goto LAB_00154454;
              iVar13 = (*((((__position._M_current)->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                         super_Displayable)._vptr_Displayable[6])();
              local_418._vptr_Function = (_func_int **)CONCAT44(extraout_var_00,iVar13);
              local_120 = &PTR_display_001ee058;
              local_118 = local_388.id;
              local_130 = &PTR_display_001ee058;
              local_128 = (uint32_t)local_360;
              (**(code **)((long)*local_418._vptr_Function + 0x18))
                        (local_418._vptr_Function,&local_120,&local_130);
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                          *)&local_288,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         &local_418);
              __position = std::
                           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           ::_M_erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                       *)local_3b8,__position);
              _Var33._M_p = (pointer)local_418._vptr_Function;
              goto LAB_00154623;
            }
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)&local_418);
LAB_00154454:
            (*((((__position._M_current)->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
              _vptr_Displayable[2])(&local_418);
            psVar3 = &local_418.name;
            pRVar26 = (RefInst *)psVar3;
            for (pRVar25 = (RefInst *)local_418.name._M_string_length; pRVar25 != (RefInst *)0x0;
                pRVar25 = *(RefInst **)((long)&(pRVar25->super_Inst).dest.id + (ulong)bVar35 * 8)) {
              bVar35 = *(uint *)((long)&(pRVar25->val).
                                        super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        .
                                        super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                        .
                                        super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                        .
                                        super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                        .
                                        super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                        .
                                        super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                        ._M_u + 0x10) < local_388.id;
              if (!bVar35) {
                pRVar26 = pRVar25;
              }
            }
            pRVar25 = (RefInst *)psVar3;
            if ((pRVar26 != (RefInst *)psVar3) &&
               (pRVar25 = pRVar26,
               local_388.id <
               *(uint *)((long)&(pRVar26->val).
                                super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .
                                super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                .
                                super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                .
                                super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                .
                                super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                .
                                super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                ._M_u + 0x10))) {
              pRVar25 = (RefInst *)psVar3;
            }
            if (pRVar25 == (RefInst *)psVar3) {
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)&local_418);
LAB_0015459d:
              __position._M_current = __position._M_current + 1;
            }
            else {
              iVar13 = (*((((__position._M_current)->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                         super_Displayable)._vptr_Displayable[1])();
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)&local_418);
              if (iVar13 != 6) goto LAB_0015459d;
              iVar13 = std::__cxx11::string::compare
                                 ((char *)(((__position._M_current)->_M_t).
                                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                           _M_head_impl + 1));
              if (iVar13 == 0) {
                iVar13 = (*((((__position._M_current)->_M_t).
                             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                           super_Displayable)._vptr_Displayable[6])();
                local_440._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_01,iVar13);
                local_140 = &PTR_display_001ee058;
                local_138 = local_388.id;
                local_150 = &PTR_display_001ee058;
                local_148 = (uint32_t)local_360;
                (**(code **)(*(size_type *)local_440._M_dataplus._M_p + 0x18))
                          (local_440._M_dataplus._M_p,&local_140,&local_150);
                pmVar20 = std::
                          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                *)local_3c0,
                               &((((__position._M_current)->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                                dest).id);
                local_1f8 = local_420;
                local_1f0 = (pmVar20->ty).
                            super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_1e8 = (pmVar20->ty).
                            super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_1e8->_M_use_count = local_1e8->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_1e8->_M_use_count = local_1e8->_M_use_count + 1;
                  }
                }
                local_1e0._0_1_ = pmVar20->is_memory_var;
                local_1e0._1_1_ = pmVar20->is_temp_var;
                local_1e0._2_1_ = pmVar20->is_phi_var;
                local_1e0._3_1_ = pmVar20->field_0x1b;
                local_1e0._4_4_ = pmVar20->priority;
                GlobalVarManager::get_new_init_id
                          ((GlobalVarManager *)&local_418,(Variable *)local_338);
                *(uint *)(local_440._M_dataplus._M_p + 0x10) = (uint)local_418.name._M_dataplus._M_p
                ;
                local_1f8 = local_420;
                if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8);
                }
                std::
                vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                ::
                emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                          ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                            *)&local_288,
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           &local_440);
                __position = std::
                             vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                             ::_M_erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                         *)local_3b8,__position);
                _Var33._M_p = local_440._M_dataplus._M_p;
LAB_00154623:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var33._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)_Var33._M_p + 0x28))();
                }
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          p_Var14 = local_1a8;
          p_Var16 = local_3c0;
          if (local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_198.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_198.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_198.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
          ::~_Rb_tree(&local_2c8);
          std::
          _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                       *)local_2f8);
          p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
        } while ((_Rb_tree_header *)p_Var27 != &local_330._M_impl.super__Rb_tree_header);
      }
      puVar5 = local_288.
               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      p_Var16 = local_250 + 3;
      for (__args = local_288.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar12 = local_218.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          __args_00 = local_218.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, __args != puVar5;
          __args = __args + 1) {
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)&p_Var16->_M_parent,__args);
      }
      for (; __args_00 != puVar12; __args_00 = __args_00 + 1) {
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)&p_Var16->_M_parent,__args_00);
      }
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::~vector(&local_218);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::~vector(&local_288);
    }
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_330);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
    ::~_Rb_tree(&local_c8.defpoint._M_t);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ::~_Rb_tree(&local_c8.usepoints._M_t);
  }
  return;
}

Assistant:

void Func_Array_Global::optimize_func(mir::inst::MirFunction& func,
                                      mir::inst::MirPackage& mir) {
  if (!func.basic_blks.size() || func.name == "$$5_main") {
    return;
  }
  auto& startBlk = func.basic_blks.begin()->second;
  var_replace::Var_Replace vp(func);
  std::set<mir::inst::VarId> ref_results;
  for (auto& inst : startBlk.inst) {
    if (inst->inst_kind() == mir::inst::InstKind::Ref &&
        inst->useVars().size()) {
      ref_results.insert(inst->dest);
    }
  }
  for (auto& inst : startBlk.inst) {
    if (inst->inst_kind() == mir::inst::InstKind::Store) {
      auto vars = inst->useVars();
      if (vars.size() > 1) {  // store must be all const(except addr)
        for (auto var : vars) {
          if (ref_results.count(var)) {
            ref_results.erase(var);
          }
        }
      }
    } else if (inst->inst_kind() == mir::inst::InstKind::Call) {
      auto& i = *inst;
      auto call = dynamic_cast<mir::inst::CallInst*>(&i);
      if (call->func == "memset") {
        continue;
      }
      auto vars = inst->useVars();
      if (vars.size() > 1) {  // store must be all const(except addr)
        for (auto var : vars) {
          if (ref_results.count(var)) {
            ref_results.erase(var);
          }
        }
      }
    }
  }

  for (auto& blk : func.basic_blks) {
    if (blk.first == startBlk.id) {
      continue;
    }
    for (auto& inst : blk.second.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Store ||
          inst->inst_kind() == mir::inst::InstKind::Call) {
        for (auto var : ref_results) {
          if (inst->useVars().count(var)) {
            ref_results.erase(var);
            break;
          }
        }
      }
    }
  }

  if (ref_results.size()) {
    GlobalVarManager gvm(mir);
    std::vector<std::unique_ptr<mir::inst::Inst>> init_insts;
    std::vector<std::unique_ptr<mir::inst::Inst>> call_insts;
    bool after_call = false;
    auto& init_func = gvm.get_init_func();
    auto& init_blk = init_func.basic_blks.begin()->second;
    for (auto& inst : init_blk.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Call) {
        after_call = true;
      }
      if (after_call) {
        call_insts.push_back(std::move(inst));
      } else {
        init_insts.push_back(std::move(inst));
      }
    }
    init_blk.inst.clear();
    for (auto var : ref_results) {
      var_replace::Var_Replace vp(func);
      auto def_point = vp.defpoint.at(var);
      auto& inst =
          func.basic_blks.at(def_point.first).inst.at(def_point.second);
      auto ref_var = *inst->useVars().begin();
      std::vector<uint32_t> val(func.variables.at(ref_var.id).size() / 4, 0);
      auto name = gvm.add_global_var(func.name, ref_var, val);
      LOG(TRACE) << "convert array " << ref_var << "in " << func.name
                 << " to global array " << name << "" << std::endl;
      inst = std::make_unique<mir::inst::RefInst>(var, name);
      auto init_var = gvm.get_new_init_id(func.variables.at(var.id));
      init_insts.push_back(
          std::make_unique<mir::inst::RefInst>(init_var, name));
      func.variables.erase(ref_var);

      for (auto iter = startBlk.inst.begin(); iter != startBlk.inst.end();) {
        auto& inst = *iter;
        if (inst->useVars().count(var) &&
            inst->inst_kind() == mir::inst::InstKind::Store) {
          auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
          ptr->replace(var, init_var);
          init_insts.push_back(std::move(ptr));
          iter = startBlk.inst.erase(iter);
        } else if (inst->useVars().count(var) &&
                   inst->inst_kind() == mir::inst::InstKind::Call) {
          auto& inst = *iter;
          auto& i = *inst;
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&i);
          if (callInst->func == "memset") {
            auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
            ptr->replace(var, init_var);
            ptr->dest = gvm.get_new_init_id(func.variables.at(inst->dest.id));
            init_insts.push_back(std::move(ptr));
            iter = startBlk.inst.erase(iter);
          }
        } else {
          iter++;
        }
      }
    }

    for (auto& inst : init_insts) {
      init_blk.inst.push_back(std::move(inst));
    }

    for (auto& inst : call_insts) {
      init_blk.inst.push_back(std::move(inst));
    }
  }
}